

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::write_hashes
          (bt_peer_connection *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  file_index_t index;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  file_storage *this_00;
  counters *this_01;
  undefined4 c;
  undefined4 uVar7;
  int64_t value;
  _func_int **pp_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  char *pcVar10;
  bool bVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  digest32<256L> *h;
  digest32<256L> *__first;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  span<const_char> buf;
  undefined1 auStack_98 [8];
  undefined1 local_90 [8];
  sha256_hash root;
  shared_ptr<libtorrent::aux::torrent> t;
  alloca_destructor<char> buf_destructor;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  char *ptr;
  
  p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98;
  lVar15 = hashes.m_len * 0x20;
  uVar14 = (int)lVar15 + 0x35;
  uVar16 = (ulong)(int)uVar14;
  ptr = (char *)this;
  if ((long)uVar16 < 0x1001) {
    if ((int)uVar14 < 1) {
      uVar16 = 0;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (auStack_98 + -(ulong)((uVar14 & 0x7ffffff5) + 0xf & 0xfffffff0));
      p_Var13 = p_Var12;
    }
  }
  else {
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar16);
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98;
  }
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var12;
  local_40 = p_Var12;
  p_Var13[-1]._M_use_count = 0x18753c;
  p_Var13[-1]._M_weak_count = 0;
  write_impl<unsigned_int,int,char*>((int)lVar15 + 0x31,(char **)&local_40);
  *(char *)&local_40->_vptr__Sp_counted_base = '\x16';
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_40->_vptr__Sp_counted_base + 1);
  p_Var1 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(ptr + 0x10);
  p_Var13[-1]._M_use_count = 0x18755c;
  p_Var13[-1]._M_weak_count = 0;
  ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_90,p_Var1);
  p_Var13[-1]._M_use_count = 0x18756b;
  p_Var13[-1]._M_weak_count = 0;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             (root.m_number._M_elems + 6),
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_90);
  p_Var13[-1]._M_use_count = 0x187574;
  p_Var13[-1]._M_weak_count = 0;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&root);
  if (root.m_number._M_elems._24_8_ != 0) {
    this_00 = *(file_storage **)(root.m_number._M_elems._24_8_ + 0x18);
    index.m_val = (req->file).m_val;
    p_Var13[-1]._M_use_count = 0x187594;
    p_Var13[-1]._M_weak_count = 0;
    file_storage::root((sha256_hash *)local_90,this_00,index);
    p_Var9 = local_40;
    p_Var13[-1]._M_use_count = 0x1875ab;
    p_Var13[-1]._M_weak_count = 0;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ::std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<unsigned_char*,char*>
                         (local_90,(uchar *)(root.m_number._M_elems + 6),(char *)p_Var9);
    iVar2 = req->base;
    p_Var13[-1]._M_use_count = 0x1875ba;
    p_Var13[-1]._M_weak_count = 0;
    write_impl<unsigned_int,int,char*>(iVar2,(char **)&local_40);
    iVar2 = req->index;
    p_Var13[-1]._M_use_count = 0x1875c6;
    p_Var13[-1]._M_weak_count = 0;
    write_impl<unsigned_int,int,char*>(iVar2,(char **)&local_40);
    iVar2 = req->count;
    p_Var13[-1]._M_use_count = 0x1875d2;
    p_Var13[-1]._M_weak_count = 0;
    write_impl<unsigned_int,int,char*>(iVar2,(char **)&local_40);
    iVar2 = req->proof_layers;
    p_Var13[-1]._M_use_count = 0x1875de;
    p_Var13[-1]._M_weak_count = 0;
    write_impl<unsigned_int,int,char*>(iVar2,(char **)&local_40);
    __first = hashes.m_ptr;
    for (; pcVar10 = ptr, p_Var9 = local_40, lVar15 != 0; lVar15 = lVar15 + -0x20) {
      p_Var13[-1]._M_use_count = 0x1875f6;
      p_Var13[-1]._M_weak_count = 0;
      local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ::std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<unsigned_char_const*,char*>
                           ((uchar *)__first,(uchar *)(__first + 1),(char *)p_Var9);
      __first = __first + 1;
    }
    this_01 = *(counters **)(ptr + 0x248);
    p_Var13[-1]._M_use_count = 0x69;
    p_Var13[-1]._M_weak_count = 0;
    c = p_Var13[-1]._M_use_count;
    p_Var13[-1]._M_use_count = 1;
    p_Var13[-1]._M_weak_count = 0;
    value._0_4_ = p_Var13[-1]._M_use_count;
    value._4_4_ = p_Var13[-1]._M_weak_count;
    p_Var13[-1]._M_use_count = 0x187619;
    p_Var13[-1]._M_weak_count = 0;
    counters::inc_stats_counter(this_01,c,value);
    p_Var13[-1]._M_use_count = 1;
    p_Var13[-1]._M_weak_count = 0;
    uVar7 = p_Var13[-1]._M_use_count;
    p_Var13[-1]._M_use_count = 0x187624;
    p_Var13[-1]._M_weak_count = 0;
    bVar11 = peer_connection::should_log((peer_connection *)pcVar10,uVar7);
    if (bVar11) {
      uVar14 = (req->file).m_val;
      uVar3 = req->base;
      uVar4 = req->index;
      uVar5 = req->count;
      uVar6 = req->proof_layers;
      p_Var13[-1]._vptr__Sp_counted_base = (_func_int **)0x1;
      pcVar10 = ptr;
      pp_Var8 = p_Var13[-1]._vptr__Sp_counted_base;
      p_Var13[-1]._vptr__Sp_counted_base = (_func_int **)(ulong)uVar6;
      p_Var13[-2]._M_use_count = (int)(ulong)uVar5;
      p_Var13[-2]._M_weak_count = (int)((ulong)uVar5 >> 0x20);
      p_Var13[-2]._vptr__Sp_counted_base = (_func_int **)(ulong)uVar4;
      p_Var13[-3]._M_use_count = 0x187664;
      p_Var13[-3]._M_weak_count = 0;
      peer_connection::peer_log
                ((peer_connection *)pcVar10,(direction_t)pp_Var8,"HASHES",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar14,(ulong)uVar3);
    }
    pcVar10 = ptr;
    p_Var13[-1]._M_use_count = 0x187678;
    p_Var13[-1]._M_weak_count = 0;
    buf.m_len = uVar16;
    buf.m_ptr = (char *)p_Var12;
    peer_connection::send_buffer((peer_connection *)pcVar10,buf);
  }
  p_Var13[-1]._M_use_count = 0x187681;
  p_Var13[-1]._M_weak_count = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
  p_Var13[-1]._M_use_count = 0x18768a;
  p_Var13[-1]._M_weak_count = 0;
  alloca_destructor<char>::~alloca_destructor
            ((alloca_destructor<char> *)
             &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void bt_peer_connection::write_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		INVARIANT_CHECK;

		int const packet_size = int(5 + sha256_hash::size()
			+ 4 * 4
			+ sha256_hash::size() * hashes.size());
		TORRENT_ALLOCA(buf, char, packet_size);
		char* ptr = buf.data();
		aux::write_uint32(packet_size - 4, ptr);
		aux::write_uint8(msg_hashes, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		for (auto const& h : hashes)
			ptr = std::copy(h.begin(), h.end(), ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hashes);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}